

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall clipp::parameter::add_flags(parameter *this,arg_string *str)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  if (str->_M_string_length != 0) {
    pcVar1 = (str->_M_dataplus)._M_p;
    _Var2 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<clipp::str::remove_ws<char,std::char_traits<char>,std::allocator<char>>(std::__cxx11::string&)::_lambda(char)_1_>>
                      (pcVar1,pcVar1 + str->_M_string_length);
    str->_M_string_length = (long)_Var2._M_current - (long)(str->_M_dataplus)._M_p;
    *_Var2._M_current = '\0';
    if (str->_M_string_length != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->flags_,
                 str);
      return;
    }
  }
  return;
}

Assistant:

void add_flags(arg_string str) {
        //empty flags are not allowed
        str::remove_ws(str);
        if(!str.empty()) flags_.push_back(std::move(str));
    }